

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O2

void set_initial_text_values(Am_Object *inter,Am_Object *cmd,Am_Object *obj,int x,int y)

{
  bool bVar1;
  Am_Value *in_value;
  ostream *poVar2;
  Am_Value value;
  Am_Object local_30;
  
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  bVar1 = Am_Object::operator!=(obj,inter);
  if (bVar1) {
    in_value = Am_Object::Get(obj,0xab,1);
    Am_Value::operator=(&value,in_value);
    bVar1 = Am_Value::Valid(&value);
    if (!bVar1 || value.type != 0x8008) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar2 = std::operator<<(poVar2,"For text interactor ");
      poVar2 = operator<<(poVar2,inter);
      poVar2 = std::operator<<(poVar2," the Am_TEXT slot of its object ");
      poVar2 = operator<<(poVar2,obj);
      poVar2 = std::operator<<(poVar2," must contain a value of type string, but it contains ");
      poVar2 = operator<<(poVar2,&value);
      std::endl<char,std::char_traits<char>>(poVar2);
      Am_Error();
    }
    Am_Object::Am_Object(&local_30,obj);
    move_text_cursor(&local_30,x,y);
    Am_Object::~Am_Object(&local_30);
  }
  Am_Object::Set(inter,0x16c,&value,1);
  Am_Object::Set(cmd,0x16c,&value,0);
  Am_Value::~Am_Value(&value);
  return;
}

Assistant:

void
set_initial_text_values(Am_Object &inter, Am_Object &cmd, Am_Object &obj, int x,
                        int y)
{
  Am_Value value;
  if (obj != inter) { //then is a text create command
    value = obj.Peek(Am_TEXT);
    if (!value.Valid() || value.type != Am_STRING) {
      Am_ERRORO("For text interactor "
                    << inter << " the Am_TEXT slot of its object " << obj
                    << " must contain a value of type string, but it contains "
                    << value,
                obj, Am_TEXT);
    }
    move_text_cursor(obj, x, y);
  }
  inter.Set(Am_OLD_VALUE, value, Am_OK_IF_NOT_THERE);
  cmd.Set(Am_OLD_VALUE, value);
}